

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(CompilerMSL *this,string *ep_args)

{
  bool bVar1;
  uint32_t uVar2;
  Resource *pRVar3;
  Resource *pRVar4;
  mapped_type *pmVar5;
  size_t sVar6;
  CompilerError *pCVar7;
  ulong uVar8;
  SPIRType *pSVar9;
  size_type sVar10;
  spirv_cross local_c98 [32];
  string local_c78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c58 [32];
  string local_c38 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c18 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf8 [32];
  string local_bd8 [32];
  undefined1 local_bb8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b38 [32];
  spirv_cross local_b18 [32];
  string local_af8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8 [32];
  string local_ab8 [32];
  string local_a98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58 [32];
  spirv_cross local_a38 [32];
  string local_a18 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f8 [32];
  string local_9d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8 [32];
  string local_998 [32];
  string local_978 [36];
  uint32_t local_954;
  spirv_cross local_950 [32];
  string local_930 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_910 [32];
  string local_8f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0 [38];
  char local_88a;
  allocator local_889;
  string local_888 [32];
  spirv_cross local_868 [32];
  string local_848 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828 [32];
  spirv_cross local_808 [32];
  string local_7e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8 [32];
  SPIRType *local_788;
  SPIRType *basetype;
  string local_760 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740 [32];
  undefined1 local_720 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0 [32];
  spirv_cross local_6c0 [32];
  string local_6a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680 [32];
  string local_660 [32];
  undefined1 local_640 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0 [36];
  uint local_57c;
  spirv_cross local_578 [32];
  string local_558 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538 [32];
  spirv_cross local_518 [32];
  string local_4f8 [32];
  undefined1 local_4d8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8 [32];
  uint local_3d8;
  char local_3d2;
  allocator local_3d1;
  uint32_t i;
  uint32_t local_3b0;
  undefined1 local_3aa;
  allocator local_3a9;
  uint32_t array_size;
  uint32_t local_384;
  spirv_cross local_380 [32];
  string local_360 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340 [32];
  undefined1 local_320 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0 [32];
  ID local_2c0;
  uint32_t local_2bc;
  ID local_2b8;
  uint32_t local_2b4;
  spirv_cross local_2b0 [8];
  string primary_name;
  mapped_type *m;
  SPIRType *pSStack_280;
  uint32_t var_id;
  SPIRType *type;
  SPIRVariable *var;
  Resource *r;
  Resource *__end1;
  Resource *__begin1;
  SmallVector<Resource,_8UL> *__range1;
  anon_class_16_2_ef385292 local_240;
  undefined1 local_230 [8];
  SmallVector<Resource,_8UL> resources;
  string *ep_args_local;
  CompilerMSL *this_local;
  
  resources.stack_storage.aligned_char._504_8_ = ep_args;
  SmallVector<Resource,_8UL>::SmallVector((SmallVector<Resource,_8UL> *)local_230);
  local_240.this = this;
  local_240.resources = (SmallVector<Resource,_8UL> *)local_230;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::__0>
            (&(this->super_CompilerGLSL).super_Compiler.ir,&local_240);
  pRVar3 = VectorView<Resource>::begin((VectorView<Resource> *)local_230);
  pRVar4 = VectorView<Resource>::end((VectorView<Resource> *)local_230);
  ::std::
  stable_sort<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::__1>
            (pRVar3,pRVar4);
  __begin1 = (Resource *)local_230;
  __end1 = VectorView<Resource>::begin((VectorView<Resource> *)__begin1);
  r = VectorView<Resource>::end((VectorView<Resource> *)__begin1);
  do {
    if (__end1 == r) {
      SmallVector<Resource,_8UL>::~SmallVector((SmallVector<Resource,_8UL> *)local_230);
      return;
    }
    var = (SPIRVariable *)__end1;
    type = (SPIRType *)__end1->var;
    pSStack_280 = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)type);
    m._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    switch((int)(var->dereference_chain).buffer_capacity) {
    case 0xf:
      pmVar5 = ::std::
               unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
               ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                            &(pSStack_280->super_IVariant).self);
      sVar6 = VectorView<spirv_cross::Meta::Decoration>::size
                        (&(pmVar5->members).super_VectorView<spirv_cross::Meta::Decoration>);
      if (sVar6 != 0) {
        if (*(long *)&(var->super_IVariant).self == 0) {
          bVar1 = VectorView<unsigned_int>::empty
                            (&(pSStack_280->array).super_VectorView<unsigned_int>);
          if (bVar1) {
            uVar8 = ::std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,", ");
            }
            get_argument_address_space_abi_cxx11_((CompilerMSL *)local_640,(SPIRVariable *)this);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_640 + 0x20),local_640);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (local_660,this,pSStack_280,0);
            ::std::operator+(local_600,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_640 + 0x20));
            ::std::operator+(local_5e0,(char *)local_600);
            to_restrict(this,m._4_4_,true);
            ::std::operator+(local_5c0,(char *)local_5e0);
            ::std::operator+(local_5a0,local_5c0);
            ::std::__cxx11::string::operator+=
                      ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_5a0);
            ::std::__cxx11::string::~string((string *)local_5a0);
            ::std::__cxx11::string::~string((string *)local_5c0);
            ::std::__cxx11::string::~string((string *)local_5e0);
            ::std::__cxx11::string::~string((string *)local_600);
            ::std::__cxx11::string::~string(local_660);
            ::std::__cxx11::string::~string((string *)(local_640 + 0x20));
            ::std::__cxx11::string::~string((string *)local_640);
            convert_to_string<unsigned_int,_0>
                      (local_6c0,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
            ::std::operator+((char *)local_6a0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x5feead);
            ::std::operator+(local_680,(char *)local_6a0);
            ::std::__cxx11::string::operator+=
                      ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_680);
            ::std::__cxx11::string::~string((string *)local_680);
            ::std::__cxx11::string::~string(local_6a0);
            ::std::__cxx11::string::~string((string *)local_6c0);
            sVar10 = ::std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                             (key_type *)((long)&m + 4));
            if (sVar10 != 0) {
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,
                         ", raster_order_group(0)");
            }
            ::std::__cxx11::string::operator+=
                      ((string *)resources.stack_storage.aligned_char._504_8_,"]]");
          }
          else {
            sVar6 = VectorView<unsigned_int>::size
                              (&(pSStack_280->array).super_VectorView<unsigned_int>);
            if (1 < sVar6) {
              local_3aa = 1;
              pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)&array_size,"Arrays of arrays of buffers are not supported.",
                         &local_3a9);
              CompilerError::CompilerError(pCVar7,(string *)&array_size);
              local_3aa = 0;
              __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            local_3b0 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSStack_280);
            if (local_3b0 == 0) {
              local_3d2 = '\x01';
              pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)&i,"Unsized arrays of buffers are not supported in MSL.",
                         &local_3d1);
              CompilerError::CompilerError(pCVar7,(string *)&i);
              local_3d2 = '\0';
              __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            this->is_using_builtin_array = true;
            SmallVector<unsigned_int,_8UL>::push_back
                      (&this->buffer_arrays_discrete,(uint *)((long)&m + 4));
            for (local_3d8 = 0; local_3d8 < local_3b0; local_3d8 = local_3d8 + 1) {
              uVar8 = ::std::__cxx11::string::empty();
              if ((uVar8 & 1) == 0) {
                ::std::__cxx11::string::operator+=
                          ((string *)resources.stack_storage.aligned_char._504_8_,", ");
              }
              get_argument_address_space_abi_cxx11_((CompilerMSL *)local_4d8,(SPIRVariable *)this);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_4d8 + 0x20),local_4d8);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        (local_4f8,this,pSStack_280,0);
              ::std::operator+(local_498,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_4d8 + 0x20));
              ::std::operator+(local_478,(char *)local_498);
              to_restrict(this,m._4_4_,true);
              ::std::operator+(local_458,(char *)local_478);
              ::std::operator+(local_438,local_458);
              ::std::operator+(local_418,(char *)local_438);
              convert_to_string<unsigned_int,_0>(local_518,&local_3d8);
              ::std::operator+(local_3f8,local_418);
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_3f8)
              ;
              ::std::__cxx11::string::~string((string *)local_3f8);
              ::std::__cxx11::string::~string((string *)local_518);
              ::std::__cxx11::string::~string((string *)local_418);
              ::std::__cxx11::string::~string((string *)local_438);
              ::std::__cxx11::string::~string((string *)local_458);
              ::std::__cxx11::string::~string((string *)local_478);
              ::std::__cxx11::string::~string((string *)local_498);
              ::std::__cxx11::string::~string(local_4f8);
              ::std::__cxx11::string::~string((string *)(local_4d8 + 0x20));
              ::std::__cxx11::string::~string((string *)local_4d8);
              local_57c = *(int *)((long)&(var->dereference_chain).buffer_capacity + 4) + local_3d8;
              convert_to_string<unsigned_int,_0>(local_578,&local_57c);
              ::std::operator+((char *)local_558,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x5feead);
              ::std::operator+(local_538,(char *)local_558);
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_538)
              ;
              ::std::__cxx11::string::~string((string *)local_538);
              ::std::__cxx11::string::~string(local_558);
              ::std::__cxx11::string::~string((string *)local_578);
              sVar10 = ::std::
                       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                               (key_type *)((long)&m + 4));
              if (sVar10 != 0) {
                ::std::__cxx11::string::operator+=
                          ((string *)resources.stack_storage.aligned_char._504_8_,
                           ", raster_order_group(0)");
              }
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,"]]");
            }
            this->is_using_builtin_array = false;
          }
        }
        else {
          if ((var->super_IVariant)._vptr_IVariant == *(_func_int ***)&(var->super_IVariant).self) {
            TypedID<(spirv_cross::Types)0>::TypedID(&local_2b8,m._4_4_);
            local_2b4 = Compiler::get_decoration((Compiler *)this,local_2b8,DecorationDescriptorSet)
            ;
            TypedID<(spirv_cross::Types)0>::TypedID(&local_2c0,m._4_4_);
            local_2bc = Compiler::get_decoration((Compiler *)this,local_2c0,DecorationBinding);
            join<char_const(&)[18],unsigned_int,char_const(&)[8],unsigned_int>
                      (local_2b0,(char (*) [18])"spvBufferAliasSet",&local_2b4,
                       (char (*) [8])"Binding",&local_2bc);
            uVar8 = ::std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,", ");
            }
            get_argument_address_space_abi_cxx11_((CompilerMSL *)local_320,(SPIRVariable *)this);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_320 + 0x20),local_320);
            ::std::operator+(local_2e0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_320 + 0x20));
            ::std::__cxx11::string::operator+=
                      ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_2e0);
            ::std::__cxx11::string::~string((string *)local_2e0);
            ::std::__cxx11::string::~string((string *)(local_320 + 0x20));
            ::std::__cxx11::string::~string((string *)local_320);
            convert_to_string<unsigned_int,_0>
                      (local_380,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
            ::std::operator+((char *)local_360,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x5feead);
            ::std::operator+(local_340,(char *)local_360);
            ::std::__cxx11::string::operator+=
                      ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_340);
            ::std::__cxx11::string::~string((string *)local_340);
            ::std::__cxx11::string::~string(local_360);
            ::std::__cxx11::string::~string((string *)local_380);
            sVar10 = ::std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                             (key_type *)((long)&m + 4));
            if (sVar10 != 0) {
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,
                         ", raster_order_group(0)");
            }
            ::std::__cxx11::string::operator+=
                      ((string *)resources.stack_storage.aligned_char._504_8_,"]]");
            ::std::__cxx11::string::~string((string *)local_2b0);
          }
          local_384 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)((var->super_IVariant)._vptr_IVariant + 1));
          SmallVector<unsigned_int,_8UL>::push_back(&this->buffer_aliases_discrete,&local_384);
        }
      }
      break;
    case 0x10:
      uVar8 = ::std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,", ");
      }
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).field_0xc);
      local_788 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
      bVar1 = type_is_msl_framebuffer_fetch(this,local_788);
      if (bVar1) {
        bVar1 = Options::is_macos(&this->msl_options);
        if ((bVar1) && (bVar1 = Options::supports_msl_version(&this->msl_options,2,3,0), !bVar1)) {
          local_88a = '\x01';
          pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_888,"Framebuffer fetch on Mac is not supported before MSL 2.3.",
                     &local_889);
          CompilerError::CompilerError(pCVar7,(string *)local_888);
          local_88a = '\0';
          __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
                  (local_8f0,this,pSStack_280,(ulong)m._4_4_);
        ::std::operator+(local_8d0,(char *)local_8f0);
        ::std::operator+(local_8b0,local_8d0);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_8b0);
        ::std::__cxx11::string::~string((string *)local_8b0);
        ::std::__cxx11::string::~string((string *)local_8d0);
        ::std::__cxx11::string::~string(local_8f0);
        convert_to_string<unsigned_int,_0>
                  (local_950,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
        ::std::operator+((char *)local_930,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         " [[color(");
        ::std::operator+(local_910,(char *)local_930);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_910);
        ::std::__cxx11::string::~string((string *)local_910);
        ::std::__cxx11::string::~string(local_930);
        ::std::__cxx11::string::~string((string *)local_950);
      }
      else {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
                  (local_7e8,this,pSStack_280,(ulong)m._4_4_);
        ::std::operator+(local_7c8,(char *)local_7e8);
        ::std::operator+(local_7a8,local_7c8);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_7a8);
        ::std::__cxx11::string::~string((string *)local_7a8);
        ::std::__cxx11::string::~string((string *)local_7c8);
        ::std::__cxx11::string::~string(local_7e8);
        if (*(int *)(var->dereference_chain).stack_storage.aligned_char != 0) {
          join<std::__cxx11::string&,unsigned_int&>
                    (local_808,&this->plane_name_suffix,
                     (uint *)&(var->dereference_chain).stack_storage);
          ::std::__cxx11::string::operator+=
                    ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_808);
          ::std::__cxx11::string::~string((string *)local_808);
        }
        convert_to_string<unsigned_int,_0>
                  (local_868,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
        ::std::operator+((char *)local_848,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         " [[texture(");
        ::std::operator+(local_828,(char *)local_848);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_828);
        ::std::__cxx11::string::~string((string *)local_828);
        ::std::__cxx11::string::~string(local_848);
        ::std::__cxx11::string::~string((string *)local_868);
        sVar10 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                         (key_type *)((long)&m + 4));
        if (sVar10 != 0) {
          ::std::__cxx11::string::operator+=
                    ((string *)resources.stack_storage.aligned_char._504_8_,
                     ", raster_order_group(0)");
        }
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,"]]");
      }
      local_954 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      sVar10 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::count(&this->atomic_image_vars,&local_954);
      if (sVar10 != 0) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_788->image);
        pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_998,this,pSVar9,0);
        ::std::operator+((char *)local_978,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ", device atomic_");
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,local_978);
        ::std::__cxx11::string::~string(local_978);
        ::std::__cxx11::string::~string(local_998);
        ::std::operator+((char *)local_9d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x5e923a);
        ::std::operator+(local_9b8,(char *)local_9d8);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_9b8);
        ::std::__cxx11::string::~string((string *)local_9b8);
        ::std::__cxx11::string::~string(local_9d8);
        convert_to_string<unsigned_int,_0>
                  (local_a38,(uint *)((var->dereference_chain).stack_storage.aligned_char + 4));
        ::std::operator+((char *)local_a18,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x5feead);
        ::std::operator+(local_9f8,(char *)local_a18);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_9f8);
        ::std::__cxx11::string::~string((string *)local_9f8);
        ::std::__cxx11::string::~string(local_a18);
        ::std::__cxx11::string::~string((string *)local_a38);
        sVar10 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                         (key_type *)((long)&m + 4));
        if (sVar10 != 0) {
          ::std::__cxx11::string::operator+=
                    ((string *)resources.stack_storage.aligned_char._504_8_,
                     ", raster_order_group(0)");
        }
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,"]]");
      }
      break;
    default:
      uVar8 = ::std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,", ");
      }
      if ((pSStack_280->pointer & 1U) == 0) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).field_0xc)
        ;
        pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
        get_type_address_space_abi_cxx11_
                  ((CompilerMSL *)local_bb8,(SPIRType *)this,(uint32_t)pSVar9,SUB41(m._4_4_,0));
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_bb8 + 0x20),local_bb8);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_bd8,this,pSStack_280,(ulong)m._4_4_);
        ::std::operator+(local_b78,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_bb8 + 0x20));
        ::std::operator+(local_b58,(char *)local_b78);
        ::std::operator+(local_b38,local_b58);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_b38);
        ::std::__cxx11::string::~string((string *)local_b38);
        ::std::__cxx11::string::~string((string *)local_b58);
        ::std::__cxx11::string::~string((string *)local_b78);
        ::std::__cxx11::string::~string(local_bd8);
        ::std::__cxx11::string::~string((string *)(local_bb8 + 0x20));
        ::std::__cxx11::string::~string((string *)local_bb8);
      }
      else {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_c38,this,pSStack_280,(ulong)m._4_4_);
        ::std::operator+(local_c18,(char *)local_c38);
        ::std::operator+(local_bf8,local_c18);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_bf8);
        ::std::__cxx11::string::~string((string *)local_bf8);
        ::std::__cxx11::string::~string((string *)local_c18);
        ::std::__cxx11::string::~string(local_c38);
      }
      convert_to_string<unsigned_int,_0>
                (local_c98,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
      ::std::operator+((char *)local_c78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5feead
                      );
      ::std::operator+(local_c58,(char *)local_c78);
      ::std::__cxx11::string::operator+=
                ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_c58);
      ::std::__cxx11::string::~string((string *)local_c58);
      ::std::__cxx11::string::~string(local_c78);
      ::std::__cxx11::string::~string((string *)local_c98);
      sVar10 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                       (key_type *)((long)&m + 4));
      if (sVar10 != 0) {
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,", raster_order_group(0)")
        ;
      }
      ::std::__cxx11::string::operator+=
                ((string *)resources.stack_storage.aligned_char._504_8_,"]]");
      break;
    case 0x12:
      uVar8 = ::std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,", ");
      }
      sampler_type_abi_cxx11_((CompilerMSL *)local_720,(SPIRType *)this,(uint32_t)pSStack_280);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_720 + 0x20),local_720);
      ::std::operator+(local_6e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_720 + 0x20));
      ::std::__cxx11::string::operator+=
                ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_6e0);
      ::std::__cxx11::string::~string((string *)local_6e0);
      ::std::__cxx11::string::~string((string *)(local_720 + 0x20));
      ::std::__cxx11::string::~string((string *)local_720);
      convert_to_string<unsigned_int,_0>
                ((spirv_cross *)&basetype,
                 (uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
      ::std::operator+((char *)local_760,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       " [[sampler(");
      ::std::operator+(local_740,(char *)local_760);
      ::std::__cxx11::string::operator+=
                ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_740);
      ::std::__cxx11::string::~string((string *)local_740);
      ::std::__cxx11::string::~string(local_760);
      ::std::__cxx11::string::~string((string *)&basetype);
      break;
    case 0x13:
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (local_ab8,this,pSStack_280,(ulong)m._4_4_);
      ::std::operator+((char *)local_a98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5fe6df
                      );
      ::std::operator+(local_a78,(char *)local_a98);
      ::std::operator+(local_a58,local_a78);
      ::std::__cxx11::string::operator+=
                ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_a58);
      ::std::__cxx11::string::~string((string *)local_a58);
      ::std::__cxx11::string::~string((string *)local_a78);
      ::std::__cxx11::string::~string(local_a98);
      ::std::__cxx11::string::~string(local_ab8);
      convert_to_string<unsigned_int,_0>
                (local_b18,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
      ::std::operator+((char *)local_af8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5feead
                      );
      ::std::operator+(local_ad8,(char *)local_af8);
      ::std::__cxx11::string::operator+=
                ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_ad8);
      ::std::__cxx11::string::~string((string *)local_ad8);
      ::std::__cxx11::string::~string(local_af8);
      ::std::__cxx11::string::~string((string *)local_b18);
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

void CompilerMSL::entry_point_args_discrete_descriptors(string &ep_args)
{
	// Output resources, sorted by resource index & type
	// We need to sort to work around a bug on macOS 10.13 with NVidia drivers where switching between shaders
	// with different order of buffers can result in issues with buffer assignments inside the driver.
	struct Resource
	{
		SPIRVariable *var;
		SPIRVariable *descriptor_alias;
		string name;
		SPIRType::BaseType basetype;
		uint32_t index;
		uint32_t plane;
		uint32_t secondary_index;
	};

	SmallVector<Resource> resources;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t var_id, SPIRVariable &var) {
		if ((var.storage == StorageClassUniform || var.storage == StorageClassUniformConstant ||
		     var.storage == StorageClassPushConstant || var.storage == StorageClassStorageBuffer) &&
		    !is_hidden_variable(var))
		{
			auto &type = get_variable_data_type(var);

			if (is_supported_argument_buffer_type(type) && var.storage != StorageClassPushConstant)
			{
				uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);
				if (descriptor_set_is_argument_buffer(desc_set))
					return;
			}

			// Handle descriptor aliasing. We can handle aliasing of buffers by casting pointers,
			// but not for typed resources.
			SPIRVariable *descriptor_alias = nullptr;
			if (var.storage == StorageClassUniform || var.storage == StorageClassStorageBuffer)
			{
				for (auto &resource : resources)
				{
					if (get_decoration(resource.var->self, DecorationDescriptorSet) ==
					    get_decoration(var_id, DecorationDescriptorSet) &&
					    get_decoration(resource.var->self, DecorationBinding) ==
					    get_decoration(var_id, DecorationBinding) &&
					    resource.basetype == SPIRType::Struct && type.basetype == SPIRType::Struct &&
					    (resource.var->storage == StorageClassUniform ||
					     resource.var->storage == StorageClassStorageBuffer))
					{
						// Possible, but horrible to implement, ignore for now.
						if (!type.array.empty())
							SPIRV_CROSS_THROW("Aliasing arrayed discrete descriptors is currently not supported.");

						descriptor_alias = resource.var;
						// Self-reference marks that we should declare the resource,
						// and it's being used as an alias (so we can emit void* instead).
						resource.descriptor_alias = resource.var;
						// Need to promote interlocked usage so that the primary declaration is correct.
						if (interlocked_resources.count(var_id))
							interlocked_resources.insert(resource.var->self);
						break;
					}
				}
			}

			const MSLConstexprSampler *constexpr_sampler = nullptr;
			if (type.basetype == SPIRType::SampledImage || type.basetype == SPIRType::Sampler)
			{
				constexpr_sampler = find_constexpr_sampler(var_id);
				if (constexpr_sampler)
				{
					// Mark this ID as a constexpr sampler for later in case it came from set/bindings.
					constexpr_samplers_by_id[var_id] = *constexpr_sampler;
				}
			}

			// Emulate texture2D atomic operations
			uint32_t secondary_index = 0;
			if (atomic_image_vars.count(var.self))
			{
				secondary_index = get_metal_resource_index(var, SPIRType::AtomicCounter, 0);
			}

			if (type.basetype == SPIRType::SampledImage)
			{
				add_resource_name(var_id);

				uint32_t plane_count = 1;
				if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
					plane_count = constexpr_sampler->planes;

				for (uint32_t i = 0; i < plane_count; i++)
					resources.push_back({ &var, descriptor_alias, to_name(var_id), SPIRType::Image,
					                      get_metal_resource_index(var, SPIRType::Image, i), i, secondary_index });

				if (type.image.dim != DimBuffer && !constexpr_sampler)
				{
					resources.push_back({ &var, descriptor_alias, to_sampler_expression(var_id), SPIRType::Sampler,
					                      get_metal_resource_index(var, SPIRType::Sampler), 0, 0 });
				}
			}
			else if (!constexpr_sampler)
			{
				// constexpr samplers are not declared as resources.
				add_resource_name(var_id);

				// Don't allocate resource indices for aliases.
				uint32_t resource_index = ~0u;
				if (!descriptor_alias)
					resource_index = get_metal_resource_index(var, type.basetype);

				resources.push_back({ &var, descriptor_alias, to_name(var_id), type.basetype,
				                      resource_index, 0, secondary_index });
			}
		}
	});

	stable_sort(resources.begin(), resources.end(), [](const Resource &lhs, const Resource &rhs) {
		return tie(lhs.basetype, lhs.index) < tie(rhs.basetype, rhs.index);
	});

	for (auto &r : resources)
	{
		auto &var = *r.var;
		auto &type = get_variable_data_type(var);

		uint32_t var_id = var.self;

		switch (r.basetype)
		{
		case SPIRType::Struct:
		{
			auto &m = ir.meta[type.self];
			if (m.members.size() == 0)
				break;

			if (r.descriptor_alias)
			{
				if (r.var == r.descriptor_alias)
				{
					auto primary_name = join("spvBufferAliasSet",
					                         get_decoration(var_id, DecorationDescriptorSet),
					                         "Binding",
					                         get_decoration(var_id, DecorationBinding));

					// Declare the primary alias as void*
					if (!ep_args.empty())
						ep_args += ", ";
					ep_args += get_argument_address_space(var) + " void* " + primary_name;
					ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
					if (interlocked_resources.count(var_id))
						ep_args += ", raster_order_group(0)";
					ep_args += "]]";
				}

				buffer_aliases_discrete.push_back(r.var->self);
			}
			else if (!type.array.empty())
			{
				if (type.array.size() > 1)
					SPIRV_CROSS_THROW("Arrays of arrays of buffers are not supported.");

				// Metal doesn't directly support this, so we must expand the
				// array. We'll declare a local array to hold these elements
				// later.
				uint32_t array_size = to_array_size_literal(type);

				if (array_size == 0)
					SPIRV_CROSS_THROW("Unsized arrays of buffers are not supported in MSL.");

				// Allow Metal to use the array<T> template to make arrays a value type
				is_using_builtin_array = true;
				buffer_arrays_discrete.push_back(var_id);
				for (uint32_t i = 0; i < array_size; ++i)
				{
					if (!ep_args.empty())
						ep_args += ", ";
					ep_args += get_argument_address_space(var) + " " + type_to_glsl(type) + "* " + to_restrict(var_id, true) +
					           r.name + "_" + convert_to_string(i);
					ep_args += " [[buffer(" + convert_to_string(r.index + i) + ")";
					if (interlocked_resources.count(var_id))
						ep_args += ", raster_order_group(0)";
					ep_args += "]]";
				}
				is_using_builtin_array = false;
			}
			else
			{
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args +=
				    get_argument_address_space(var) + " " + type_to_glsl(type) + "& " + to_restrict(var_id, true) + r.name;
				ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			break;
		}
		case SPIRType::Sampler:
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += sampler_type(type, var_id) + " " + r.name;
			ep_args += " [[sampler(" + convert_to_string(r.index) + ")]]";
			break;
		case SPIRType::Image:
		{
			if (!ep_args.empty())
				ep_args += ", ";

			// Use Metal's native frame-buffer fetch API for subpass inputs.
			const auto &basetype = get<SPIRType>(var.basetype);
			if (!type_is_msl_framebuffer_fetch(basetype))
			{
				ep_args += image_type_glsl(type, var_id) + " " + r.name;
				if (r.plane > 0)
					ep_args += join(plane_name_suffix, r.plane);
				ep_args += " [[texture(" + convert_to_string(r.index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			else
			{
				if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 3))
					SPIRV_CROSS_THROW("Framebuffer fetch on Mac is not supported before MSL 2.3.");
				ep_args += image_type_glsl(type, var_id) + " " + r.name;
				ep_args += " [[color(" + convert_to_string(r.index) + ")]]";
			}

			// Emulate texture2D atomic operations
			if (atomic_image_vars.count(var.self))
			{
				ep_args += ", device atomic_" + type_to_glsl(get<SPIRType>(basetype.image.type), 0);
				ep_args += "* " + r.name + "_atomic";
				ep_args += " [[buffer(" + convert_to_string(r.secondary_index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			break;
		}
		case SPIRType::AccelerationStructure:
			ep_args += ", " + type_to_glsl(type, var_id) + " " + r.name;
			ep_args += " [[buffer(" + convert_to_string(r.index) + ")]]";
			break;
		default:
			if (!ep_args.empty())
				ep_args += ", ";
			if (!type.pointer)
				ep_args += get_type_address_space(get<SPIRType>(var.basetype), var_id) + " " +
				           type_to_glsl(type, var_id) + "& " + r.name;
			else
				ep_args += type_to_glsl(type, var_id) + " " + r.name;
			ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
			if (interlocked_resources.count(var_id))
				ep_args += ", raster_order_group(0)";
			ep_args += "]]";
			break;
		}
	}
}